

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeTableGet<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Ok *pOVar1;
  bool bVar2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> table;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
  maybeTableidx<wasm::WATParser::ParseDeclsCtx>
            ((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)local_78,(MaybeResult<wasm::Ok> *)__return_storage_ptr___00);
  local_90 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_78);
  bVar2 = local_90 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_78);
  if (bVar2) {
    pOVar1 = MaybeResult<wasm::Ok>::getPtr
                       ((MaybeResult<wasm::Ok> *)
                        ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
    NullInstrParserCtx::makeTableGet
              (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,pOVar1);
  }
  MaybeResult<wasm::Ok>::~MaybeResult
            ((MaybeResult<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeTableGet(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto table = maybeTableidx(ctx);
  CHECK_ERR(table);
  return ctx.makeTableGet(pos, annotations, table.getPtr());
}